

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O2

int ERKStepWriteParameters(void *arkode_mem,FILE *fp)

{
  int iVar1;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepWriteParameters",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    iVar1 = arkWriteParameters((ARKodeMem)arkode_mem,fp);
    if (iVar1 == 0) {
      fwrite("ERKStep time step module parameters:\n",0x25,1,(FILE *)fp);
      iVar1 = 0;
      fprintf((FILE *)fp,"  Method order %i\n",(ulong)(uint)step_mem->q);
      fputc(10,(FILE *)fp);
    }
    else {
      arkProcessError(ark_mem,-0x15,"ARKode::ERKStep","ERKStepWriteParameters",
                      "Error writing ARKode infrastructure parameters");
    }
  }
  return iVar1;
}

Assistant:

int ERKStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* output ARKode infrastructure parameters first */
  retval = arkWriteParameters(arkode_mem, fp);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(retval);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ERKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n",step_mem->q);
  fprintf(fp, "\n");

  return(ARK_SUCCESS);
}